

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__build_huffman(stbi__huffman *h,int *count)

{
  ushort uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  byte bVar4;
  long lVar5;
  stbi_uc *psVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  stbi__uint16 *psVar11;
  long lVar12;
  
  lVar5 = 0;
  iVar7 = 0;
  do {
    if (0 < count[lVar5]) {
      lVar12 = 0;
      do {
        h->size[lVar12 + iVar7] = (char)lVar5 + '\x01';
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 < count[lVar5]);
      iVar7 = iVar7 + (int)lVar12;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  h->size[iVar7] = '\0';
  uVar10 = 0;
  uVar2 = 1;
  uVar8 = 0;
  do {
    h->delta[uVar2] = uVar8 - uVar10;
    if (uVar2 == h->size[(int)uVar8]) {
      psVar11 = h->code + (int)uVar8;
      psVar6 = h->size + (long)(int)uVar8 + 1;
      do {
        uVar9 = uVar10;
        *psVar11 = (stbi__uint16)uVar9;
        uVar10 = uVar9 + 1;
        bVar4 = *psVar6;
        psVar11 = psVar11 + 1;
        uVar8 = uVar8 + 1;
        psVar6 = psVar6 + 1;
      } while (uVar2 == bVar4);
      if (uVar9 >> ((byte)uVar2 & 0x1f) != 0) {
        puVar3 = (undefined8 *)__tls_get_addr(&PTR_0012de18);
        *puVar3 = "bad code lengths";
        return 0;
      }
    }
    h->maxcode[uVar2] = uVar10 << (0x10 - (byte)uVar2 & 0x1f);
    uVar10 = uVar10 * 2;
    uVar2 = uVar2 + 1;
    if (uVar2 == 0x11) {
      h->maxcode[0x11] = 0xffffffff;
      memset(h,0xff,0x200);
      if (0 < (int)uVar8) {
        uVar2 = 0;
        do {
          if (h->size[uVar2] < 10) {
            uVar1 = h->code[uVar2];
            bVar4 = 9 - h->size[uVar2];
            lVar5 = 0;
            do {
              h->fast[lVar5 + ((ulong)uVar1 << (bVar4 & 0x3f))] = (stbi_uc)uVar2;
              lVar5 = lVar5 + 1;
            } while ((uint)lVar5 >> (bVar4 & 0x1f) == 0);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != uVar8);
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__build_huffman(stbi__huffman *h, int *count)
{
   int i,j,k=0;
   unsigned int code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i)
      for (j=0; j < count[i]; ++j)
         h->size[k++] = (stbi_uc) (i+1);
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (stbi__uint16) (code++);
         if (code-1 >= (1u << j)) return stbi__err("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (stbi_uc) i;
         }
      }
   }
   return 1;
}